

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeContextEvictImagePrologue
          (ZEParameterValidation *this,ze_context_handle_t hContext,ze_device_handle_t hDevice,
          ze_image_handle_t hImage)

{
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_SUCCESS;
  if (hImage == (ze_image_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  if (hDevice == (ze_device_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  if (hContext == (ze_context_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeContextEvictImagePrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        ze_image_handle_t hImage                        ///< [in] handle of image to make evict
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hImage )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        return ZE_RESULT_SUCCESS;
    }